

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.cpp
# Opt level: O2

void rasterize(vector<Shape,_std::allocator<Shape>_> *shapes,char *file_name,size_t width,
              size_t height)

{
  _Base_ptr *pp_Var1;
  pointer pEVar2;
  pointer pEVar3;
  Line *pLVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  float fVar7;
  float fVar8;
  Type TVar9;
  int iVar10;
  pointer pSVar11;
  pointer pSVar12;
  size_t __topIndex;
  size_t sVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pointer pRVar17;
  size_t sVar18;
  pointer __first;
  pointer pEVar19;
  size_t i;
  long lVar20;
  ulong uVar21;
  _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  *this;
  pointer pRVar22;
  iterator __position;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  pointer ppRVar25;
  pointer ppRVar26;
  pointer pRVar27;
  RasterizeLine *extraout_RDX;
  _Base_ptr p_Var28;
  RasterizeLine *extraout_RDX_00;
  RasterizeLine *extraout_RDX_01;
  RasterizeLine *extraout_RDX_02;
  RasterizeLine *extraout_RDX_03;
  RasterizeLine *extraout_RDX_04;
  RasterizeLine *extraout_RDX_05;
  RasterizeLine *__s;
  RasterizeLine *extraout_RDX_06;
  RasterizeLine *extraout_RDX_07;
  Shape *shape;
  pointer pSVar29;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  __last;
  pointer pRVar30;
  size_t __n;
  ulong uVar31;
  pointer __dest;
  _Base_ptr p_Var32;
  pointer pRVar33;
  RasterizeLine *pRVar34;
  Segment *s;
  pointer pSVar35;
  float x4;
  anon_class_4_1_54a39819 aVar36;
  anon_class_4_1_54a39819 aVar37;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  _Var38;
  float fVar39;
  float fVar40;
  float fVar41;
  float extraout_XMM0_Db;
  undefined4 uVar42;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar43;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  anon_class_4_1_54a39819 aVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  Event __value;
  undefined1 local_238 [16];
  undefined1 local_228 [48];
  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  current_lines;
  ShapeMap shapes_1;
  pointer local_1a8;
  undefined1 local_198 [28];
  float x0;
  float x2;
  float x1;
  float x3;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  lines;
  Color local_148;
  _Base_ptr local_130;
  pointer local_128;
  Strip strip;
  float local_100;
  float local_fc;
  undefined1 local_f8 [12];
  float fStack_ec;
  Pixmap pixmap;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float y1;
  float y0;
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  events;
  
  lines.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  events.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  events.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar11 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (pSVar29 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
                 super__Vector_impl_data._M_start; pSVar29 != pSVar11; pSVar29 = pSVar29 + 1) {
    pSVar12 = (pSVar29->segments).super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pSVar35 = (pSVar29->segments).super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl
                   .super__Vector_impl_data._M_start; pSVar35 != pSVar12; pSVar35 = pSVar35 + 1) {
      lVar20 = ((long)lines.
                      super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)lines.
                     super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      shapes_1.
      super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pSVar29;
      if (pSVar35->y1 < pSVar35->y0 || pSVar35->y1 == pSVar35->y0) {
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_8_ = pSVar35->line;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::push_back(&lines,(value_type *)&shapes_1);
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_8_ = (ulong)(uint)pSVar35->y1 << 0x20;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar20;
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push(&events,(value_type *)&shapes_1);
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._4_4_ = pSVar35->y0;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_4_ = 1;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar20;
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push(&events,(value_type *)&shapes_1);
      }
      else {
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_8_ = pSVar35->line;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::push_back(&lines,(value_type *)&shapes_1);
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_8_ = (ulong)(uint)pSVar35->y0 << 0x20;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar20;
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push(&events,(value_type *)&shapes_1);
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._4_4_ = pSVar35->y1;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl._0_4_ = 1;
        shapes_1.
        super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = lVar20;
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push(&events,(value_type *)&shapes_1);
      }
    }
  }
  Pixmap::Pixmap(&pixmap,width,height);
  __first = events.c.
            super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_238 = ZEXT816(0);
  if (events.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      events.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_238 = ZEXT416((uint)(events.c.
                               super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                               ._M_impl.super__Vector_impl_data._M_start)->y);
  }
  current_lines.
  super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  current_lines.
  super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  current_lines.
  super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var6 = &shapes_1.
            super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  __s = extraout_RDX;
  do {
    while( true ) {
      pEVar19 = events.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (__first ==
          events.c.
          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        write_png(&pixmap,file_name);
        std::
        vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
        ::~vector(&current_lines);
        std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                  ((_Vector_base<Color,_std::allocator<Color>_> *)&pixmap);
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::~priority_queue(&events);
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::~vector(&lines);
        return;
      }
      TVar9 = __first->type;
      fVar7 = __first->y;
      local_130 = (_Base_ptr)__first->index;
      if (0x10 < (long)events.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)__first) {
        __topIndex._0_4_ =
             events.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].type;
        __topIndex._4_4_ =
             events.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].y;
        sVar13 = events.c.
                 super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].index;
        fVar44 = __first->y;
        sVar18 = __first->index;
        events.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].type = __first->type;
        events.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].y = fVar44;
        events.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].index = sVar18;
        uVar31 = (long)events.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)__first);
        p_Var32 = (_Base_ptr)((long)uVar31 >> 4);
        p_Var24 = (_Base_ptr)0x0;
        while ((long)p_Var24 < (long)((long)&p_Var32[-1]._M_right + 7) / 2) {
          p_Var5 = (_Base_ptr)((long)p_Var24 * 2 + 2);
          p_Var28 = (_Base_ptr)((long)p_Var24 * 2 + 1);
          if (__first[(long)p_Var5].y < __first[(long)p_Var28].y ||
              __first[(long)p_Var5].y == __first[(long)p_Var28].y) {
            p_Var28 = p_Var5;
          }
          pEVar2 = __first + (long)p_Var28;
          fVar44 = pEVar2->y;
          sVar18 = pEVar2->index;
          pEVar3 = __first + (long)p_Var24;
          pEVar3->type = pEVar2->type;
          pEVar3->y = fVar44;
          pEVar3->index = sVar18;
          p_Var24 = p_Var28;
        }
        width = (size_t)p_Var24;
        if (((uVar31 & 0x10) == 0) &&
           (p_Var32 = (_Base_ptr)((long)((long)&p_Var32[-1]._M_right + 6) >> 1), p_Var24 == p_Var32)
           ) {
          width = (long)p_Var24 * 2 + 1;
          pEVar2 = __first + width;
          fVar44 = pEVar2->y;
          sVar18 = pEVar2->index;
          pEVar3 = __first + (long)p_Var24;
          pEVar3->type = pEVar2->type;
          pEVar3->y = fVar44;
          pEVar3->index = sVar18;
        }
        __value.index = __topIndex;
        __value._0_8_ = sVar13;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Event*,std::vector<(anonymous_namespace)::Event,std::allocator<(anonymous_namespace)::Event>>>,long,(anonymous_namespace)::Event,__gnu_cxx::__ops::_Iter_comp_val<std::greater<(anonymous_namespace)::Event>>>
                  ((__normal_iterator<(anonymous_namespace)::Event_*,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>_>
                    )__first,width,__topIndex,__value,
                   (_Iter_comp_val<std::greater<(anonymous_namespace)::Event>_> *)p_Var32);
        __s = extraout_RDX_00;
      }
      events.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar19 + -1;
      while( true ) {
        ppRVar25 = current_lines.
                   super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        ppRVar26 = current_lines.
                   super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (fVar7 <= (float)local_238._0_4_) break;
        uVar31 = (long)current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar20 = (long)current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (current_lines.
            super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            current_lines.
            super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar14 = 0x3f;
          if (uVar31 != 0) {
            for (; uVar31 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                    ((__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                      )current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                      )current_lines.
                       super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                      )local_238._0_4_);
          if (lVar20 < 0x81) {
            width = (size_t)ppRVar25;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                      ((__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                        )ppRVar26,
                       (__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                        )ppRVar25,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                        )local_238._0_4_);
            __s = extraout_RDX_03;
          }
          else {
            __last._M_current = ppRVar26 + 0x10;
            width = (size_t)__last._M_current;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                      ((__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                        )ppRVar26,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                        )local_238._0_4_);
            __s = extraout_RDX_01;
            for (; __last._M_current != ppRVar25; __last._M_current = __last._M_current + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                        (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                                 )local_238._0_4_);
              __s = extraout_RDX_02;
            }
          }
        }
        aVar36.y = fVar7;
        for (uVar21 = 1; uVar21 < uVar31; uVar21 = uVar21 + 1) {
          __s = ppRVar26[uVar21];
          fVar44 = (ppRVar26[uVar21 - 1]->super_Line).m;
          fVar56 = (__s->super_Line).m;
          if (((fVar44 != fVar56) || (aVar37.y = aVar36.y, NAN(fVar44) || NAN(fVar56))) &&
             (aVar37.y = ((__s->super_Line).x0 - (ppRVar26[uVar21 - 1]->super_Line).x0) /
                         (fVar44 - fVar56),
             aVar37.y <= (float)local_238._0_4_ || aVar36.y <= aVar37.y)) {
            aVar37.y = aVar36.y;
          }
          aVar36.y = aVar37.y;
        }
        strip.lines.
        super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        strip.lines.
        super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        strip.lines.
        super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8 = (pointer)0x0;
        strip.y0 = (float)local_238._0_4_;
        strip.y1 = aVar36.y;
        for (; pRVar30 = strip.lines.
                         super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                         ._M_impl.super__Vector_impl_data._M_finish, ppRVar26 != ppRVar25;
            ppRVar26 = ppRVar26 + 1) {
          pRVar34 = *ppRVar26;
          if (strip.lines.
              super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              strip.lines.
              super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                    *)std::
                      vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                      ::_M_check_len(&strip.lines,width,(char *)__s);
            pRVar22 = std::
                      _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                      ::_M_allocate(this,width);
            lVar20 = (long)pRVar30 - (long)local_1a8;
            *(Shape **)((long)pRVar22 + lVar20 + 0x10) = pRVar34->shape;
            iVar10 = pRVar34->direction;
            uVar42 = *(undefined4 *)&pRVar34->field_0xc;
            pLVar4 = (Line *)((long)pRVar22 + lVar20);
            *pLVar4 = pRVar34->super_Line;
            pLVar4[1].m = (float)iVar10;
            pLVar4[1].x0 = (float)uVar42;
            pRVar17 = pRVar22;
            for (pRVar27 = local_1a8; pRVar33 = pRVar17 + 1, pRVar27 != pRVar30;
                pRVar27 = pRVar27 + 1) {
              pRVar17->shape = pRVar27->shape;
              iVar10 = pRVar27->direction;
              uVar42 = *(undefined4 *)&pRVar27->field_0xc;
              pRVar17->super_Line = pRVar27->super_Line;
              pRVar17->direction = iVar10;
              *(undefined4 *)&pRVar17->field_0xc = uVar42;
              pRVar17 = pRVar33;
            }
            width = lVar20 / 0x18;
            std::
            _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            ::_M_deallocate((_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                             *)local_1a8,(pointer)width,lVar20 % 0x18);
            strip.lines.
            super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar22 + (long)this;
            __s = extraout_RDX_04;
            local_1a8 = pRVar22;
            strip.lines.
            super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            ._M_impl.super__Vector_impl_data._M_start = pRVar22;
          }
          else {
            (strip.lines.
             super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
             ._M_impl.super__Vector_impl_data._M_finish)->shape = pRVar34->shape;
            iVar10 = pRVar34->direction;
            uVar42 = *(undefined4 *)&pRVar34->field_0xc;
            (strip.lines.
             super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
             ._M_impl.super__Vector_impl_data._M_finish)->super_Line = pRVar34->super_Line;
            (strip.lines.
             super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
             ._M_impl.super__Vector_impl_data._M_finish)->direction = iVar10;
            *(undefined4 *)
             &(strip.lines.
               super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
               ._M_impl.super__Vector_impl_data._M_finish)->field_0xc = uVar42;
            pRVar33 = strip.lines.
                      super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          strip.lines.
          super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar33;
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = pixmap.width;
        auVar16._8_8_ = 0;
        auVar16._0_8_ =
             (long)pixmap.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)pixmap.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4;
        uVar31 = SUB168(auVar16 / auVar15,0);
        if ((long)uVar31 < 0) {
          fVar44 = (float)((ulong)(SUB164(auVar16 / auVar15,0) & 1) | uVar31 >> 1);
          fVar44 = fVar44 + fVar44;
        }
        else {
          fVar44 = (float)(long)uVar31;
        }
        _Var38._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)0.0;
        if (0.0 <= (float)local_238._0_4_) {
          _Var38._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_238._0_4_;
        }
        aVar37.y = fVar44 + -0.5;
        if (aVar36.y <= fVar44 + -0.5) {
          aVar37.y = aVar36.y;
        }
        local_128 = strip.lines.
                    super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)strip.lines.
                       super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)strip.lines.
                       super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar31 = (long)((float)_Var38._M_comp.y - 9.223372e+18) &
                 (long)(float)_Var38._M_comp.y >> 0x3f | (long)(float)_Var38._M_comp.y;
        while( true ) {
          fVar44 = (float)uVar31;
          uStack_c4 = 0;
          uStack_c0 = 0;
          uStack_bc = 0;
          if (aVar37.y <= fVar44) break;
          fVar56 = (float)(uVar31 + 1);
          _Var38._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_238._0_4_;
          if ((float)local_238._0_4_ <= fVar44) {
            _Var38._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)fVar44;
          }
          aVar52.y = aVar36.y;
          if (fVar56 <= aVar36.y) {
            aVar52.y = fVar56;
          }
          shapes_1.
          super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               shapes_1.
               super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          shapes_1.
          super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          shapes_1.
          super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fVar56 = aVar52.y - (float)_Var38._M_comp.y;
          uVar21 = 1;
          shapes_1.
          super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
          shapes_1.
          super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
          for (; uVar21 < (ulong)(lVar20 / 0x18); uVar21 = uVar21 + 1) {
            local_f8._0_8_ = local_128[uVar21 - 1].shape;
            iVar10 = local_128[uVar21 - 1].direction;
            width = (size_t)local_f8;
            __position = std::
                         _Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                         ::find((_Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                                 *)&shapes_1,(key_type *)width);
            if ((_Rb_tree_header *)__position._M_node == p_Var6) {
              local_148.b = (float)iVar10;
              local_148.r = (float)local_f8._0_4_;
              local_148.g = (float)local_f8._4_4_;
              width = (size_t)&local_148;
              std::
              _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
              ::_M_emplace_unique<std::pair<Shape_const*,int>>
                        ((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                          *)&shapes_1,(pair<const_Shape_*,_int> *)&local_148);
            }
            else {
              pp_Var1 = &__position._M_node[1]._M_parent;
              *(int *)pp_Var1 = *(int *)pp_Var1 + iVar10;
              if (*(int *)pp_Var1 == 0) {
                std::
                _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                ::erase_abi_cxx11_((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                                    *)&shapes_1,__position);
                width = (size_t)__position._M_node;
              }
            }
            if (shapes_1.
                super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              pRVar30 = local_128 + uVar21;
              fVar8 = pRVar30[-1].super_Line.m;
              fVar59 = pRVar30[-1].super_Line.x0;
              fVar39 = fVar8 * (float)_Var38._M_comp.y + fVar59;
              fVar59 = fVar8 * aVar52.y + fVar59;
              fVar8 = (pRVar30->super_Line).m;
              fVar45 = (pRVar30->super_Line).x0;
              fVar60 = fVar8 * (float)_Var38._M_comp.y + fVar45;
              fVar45 = fVar8 * aVar52.y + fVar45;
              fVar55 = fVar39;
              fVar8 = fVar59;
              if (fVar39 <= fVar59) {
                fVar55 = fVar59;
                fVar8 = fVar39;
              }
              fVar61 = fVar60;
              if (fVar60 <= fVar45) {
                fVar61 = fVar45;
                fVar45 = fVar60;
              }
              fVar60 = 0.0;
              if (0.0 <= fVar8) {
                fVar60 = fVar8;
              }
              fVar57 = (float)pixmap.width + -0.5;
              if (fVar61 <= (float)pixmap.width + -0.5) {
                fVar57 = fVar61;
              }
              fVar46 = (fVar55 - fVar8) / fVar56;
              fVar53 = fVar8 - fVar46 * (float)_Var38._M_comp.y;
              fVar41 = 0.0;
              uVar42 = 0;
              uVar43 = 0;
              fVar40 = (fVar61 - fVar45) / fVar56;
              fVar49 = 0.0;
              uVar50 = 0;
              uVar51 = 0;
              fVar47 = fVar45 - fVar40 * (float)_Var38._M_comp.y;
              p_Var24 = (_Base_ptr)
                        ((long)(fVar60 - 9.223372e+18) & (long)fVar60 >> 0x3f | (long)fVar60);
              while (fVar60 = (float)p_Var24, fVar60 < fVar57) {
                p_Var32 = (_Base_ptr)((long)&((Line *)&p_Var24->_M_color)->m + 1);
                fVar48 = (float)p_Var32;
                fVar58 = fVar56;
                if (fVar60 < fVar55) {
                  if (fVar8 <= fVar60) {
                    fVar58 = (((fVar55 + fVar60) - fVar60) - fVar60) *
                             (aVar52.y - (fVar60 - fVar53) / fVar46);
                  }
                  else {
                    fVar58 = (((fVar59 + fVar39) - fVar60) - fVar60) * fVar56;
                  }
                  fVar58 = fVar58 * -0.5 + fVar56;
                  if (fVar48 < fVar55) {
                    fVar58 = fVar58 + (((fVar55 + fVar48) - fVar48) - fVar48) *
                                      (aVar52.y - (fVar48 - fVar53) / fVar46) * 0.5;
                  }
                }
                if (fVar45 < fVar48) {
                  if (fVar48 <= fVar61) {
                    fVar54 = (((fVar48 + fVar48) - fVar45) - fVar48) *
                             ((fVar48 - fVar47) / fVar40 - (float)_Var38._M_comp.y);
                  }
                  else {
                    fVar54 = (((fVar48 + fVar48) - fVar45) - fVar61) * fVar56;
                  }
                  fVar58 = fVar58 + fVar54 * -0.5;
                  if (fVar45 < fVar60) {
                    fVar48 = (fVar60 - fVar47) / fVar40 - (float)_Var38._M_comp.y;
                    fVar58 = fVar58 + (((fVar60 + fVar60) - fVar45) - fVar60) * fVar48 * 0.5;
                    fVar49 = fVar41;
                    uVar50 = uVar42;
                    uVar51 = uVar43;
                  }
                }
                local_100 = fVar60 + 0.5;
                local_148 = (Color)ZEXT816(0);
                local_228._0_16_ = ZEXT816(0);
                local_198._0_16_ = ZEXT816(0);
                local_fc = fVar44 + 0.5;
                for (p_Var23 = shapes_1.
                               super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var23 != p_Var6;
                    p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
                  local_f8._0_8_ =
                       (**(code **)**(undefined8 **)(*(long *)(p_Var23 + 1) + 0x18))
                                 (*(undefined8 **)(*(long *)(p_Var23 + 1) + 0x18),&local_100);
                  local_f8._8_4_ = fVar48;
                  fStack_ec = fVar49;
                  local_148 = blend(&local_148,(Color *)local_f8);
                  fVar48 = local_148.b;
                  fVar49 = local_148.a;
                  local_198._8_4_ = extraout_XMM0_Dc;
                  local_198._0_8_ = local_148._0_8_;
                  local_198._12_4_ = extraout_XMM0_Dd;
                  local_228._8_4_ = uVar50;
                  local_228._0_8_ = local_148._8_8_;
                  local_228._12_4_ = uVar51;
                }
                local_148.g = (float)local_198._4_4_ * fVar58;
                local_148.r = (float)local_198._0_4_ * fVar58;
                local_148.b = fVar58 * (float)local_228._0_4_;
                local_148.a = fVar58 * (float)local_228._4_4_;
                Pixmap::add_pixel(&pixmap,(size_t)p_Var24,uVar31,(Color *)&local_148);
                width = (size_t)p_Var24;
                p_Var24 = p_Var32;
                fVar41 = extraout_XMM0_Db;
                uVar42 = extraout_XMM0_Dc_00;
                uVar43 = extraout_XMM0_Dd_00;
              }
            }
          }
          std::
          _Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
          ::~_Rb_tree((_Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                       *)&shapes_1);
          uVar31 = uVar31 + 1;
        }
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::~vector(&strip.lines);
        __s = extraout_RDX_05;
        local_238._0_4_ = aVar36.y;
        local_238._4_4_ = uStack_c4;
        local_238._8_4_ = uStack_c0;
        local_238._12_4_ = uStack_bc;
      }
      if (TVar9 == LINE_END) break;
      if (TVar9 == LINE_START) {
        pRVar34 = lines.
                  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_130;
        if (current_lines.
            super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            current_lines.
            super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __n = (long)current_lines.
                      super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)current_lines.
                      super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          width = (long)__n >> 3;
          p_Var24 = (_Base_ptr)width;
          if (current_lines.
              super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              current_lines.
              super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            p_Var24 = (_Base_ptr)0x1;
          }
          uVar31 = (long)&((Line *)&p_Var24->_M_color)->m +
                   (long)&((Line *)&((_Base_ptr)width)->_M_color)->m;
          if (0xffffffffffffffe < uVar31) {
            uVar31 = 0xfffffffffffffff;
          }
          if (CARRY8((ulong)p_Var24,width)) {
            uVar31 = 0xfffffffffffffff;
          }
          if (uVar31 == 0) {
            ppRVar25 = (pointer)0x0;
          }
          else {
            ppRVar25 = (pointer)operator_new(uVar31 * 8);
          }
          ppRVar25[width] = pRVar34;
          if (0 < (long)__n) {
            memmove(ppRVar25,ppRVar26,__n);
          }
          std::
          _Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
          ::_M_deallocate((_Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                           *)ppRVar26,(pointer)width,(size_t)ppRVar26);
          current_lines.
          super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar25 + uVar31;
          __s = extraout_RDX_07;
          current_lines.
          super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
          ._M_impl.super__Vector_impl_data._M_start = ppRVar25;
          current_lines.
          super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppRVar25 + __n + 8);
        }
        else {
          *current_lines.
           super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = pRVar34;
          current_lines.
          super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               current_lines.
               super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    pRVar34 = lines.
              super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)local_130;
    __s = (RasterizeLine *)
          ((long)current_lines.
                 super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)current_lines.
                super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                ._M_impl.super__Vector_impl_data._M_start);
    for (lVar20 = (long)__s >> 5; 0 < lVar20; lVar20 = lVar20 + -1) {
      __dest = ppRVar26;
      if (*ppRVar26 == pRVar34) goto LAB_0010d6a1;
      if (ppRVar26[1] == pRVar34) {
        __dest = ppRVar26 + 1;
        goto LAB_0010d6a1;
      }
      if (ppRVar26[2] == pRVar34) {
        __dest = ppRVar26 + 2;
        goto LAB_0010d6a1;
      }
      if (ppRVar26[3] == pRVar34) {
        __dest = ppRVar26 + 3;
        goto LAB_0010d6a1;
      }
      ppRVar26 = ppRVar26 + 4;
      __s = (RasterizeLine *)&__s[-2].shape;
    }
    __s = (RasterizeLine *)((long)__s >> 3);
    if (__s == (RasterizeLine *)0x1) {
LAB_0010d685:
      __dest = ppRVar26;
      if (*ppRVar26 != pRVar34) {
        __dest = current_lines.
                 super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (__s == (RasterizeLine *)0x2) {
LAB_0010d67c:
      __dest = ppRVar26;
      if (*ppRVar26 != pRVar34) {
        ppRVar26 = ppRVar26 + 1;
        goto LAB_0010d685;
      }
    }
    else {
      __dest = current_lines.
               super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((__s == (RasterizeLine *)0x3) && (__dest = ppRVar26, *ppRVar26 != pRVar34)) {
        ppRVar26 = ppRVar26 + 1;
        goto LAB_0010d67c;
      }
    }
LAB_0010d6a1:
    width = (size_t)(__dest + 1);
    if ((pointer)width !=
        current_lines.
        super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      memmove(__dest,(void *)width,
              (long)current_lines.
                    super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - width);
      __s = extraout_RDX_06;
    }
    current_lines.
    super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppRVar25 + -1;
  } while( true );
}

Assistant:

void rasterize(const std::vector<Shape>& shapes, const char* file_name, size_t width, size_t height) {
	// collect lines and events
	std::vector<RasterizeLine> lines;
	std::priority_queue<Event, std::vector<Event>, std::greater<Event>> events;
	for (const Shape& shape: shapes) {
		for (const Segment& s: shape.segments) {
			const size_t index = lines.size();
			if (s.y0 < s.y1) {
				lines.push_back(RasterizeLine(s.line, 1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y0, index));
				events.push(Event(Event::Type::LINE_END, s.y1, index));
			}
			else {
				lines.push_back(RasterizeLine(s.line, -1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y1, index));
				events.push(Event(Event::Type::LINE_END, s.y0, index));
			}
		}
	}

	Pixmap pixmap(width, height);

	float y = events.empty() ? 0.f : events.top().y;
	std::vector<const RasterizeLine*> current_lines;
	while (!events.empty()) {
		Event event = events.top();
		events.pop();
		while (y < event.y) {
			std::sort(current_lines.begin(), current_lines.end(), [y](const RasterizeLine* l0, const RasterizeLine* l1) {
				const float x0 = l0->get_x(y);
				const float x1 = l1->get_x(y);
				if (x0 == x1) {
					return l0->m < l1->m;
				}
				return x0 < x1;
			});
			float next_y = event.y;
			// find intersections
			for (size_t i = 1; i < current_lines.size(); ++i) {
				const RasterizeLine& l0 = *current_lines[i-1];
				const RasterizeLine& l1 = *current_lines[i];
				if (l0.m != l1.m) {
					const float intersection = intersect(l0, l1);
					if (y < intersection && intersection < next_y) {
						next_y = intersection;
					}
				}
			}
			Strip strip(y, next_y);
			for (const RasterizeLine* line: current_lines) {
				strip.lines.push_back(*line);
			}
			rasterize_strip(strip, pixmap);
			y = next_y;
		}
		switch (event.type) {
		case Event::Type::LINE_START:
			current_lines.push_back(&lines[event.index]);
			break;
		case Event::Type::LINE_END:
			current_lines.erase(std::find(current_lines.begin(), current_lines.end(), &lines[event.index]));
			break;
		}
	}

	write_png(pixmap, file_name);
}